

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidBuildAContentModel(xmlElementContentPtr content,xmlValidCtxtPtr ctxt,xmlChar *name)

{
  xmlElementContentOccur xVar1;
  xmlAutomataStatePtr pxVar2;
  int iVar3;
  xmlAutomataStatePtr pxVar4;
  xmlAutomataStatePtr pxVar5;
  xmlAutomataStatePtr to;
  xmlChar *token;
  char *msg;
  xmlAutomataPtr am;
  xmlChar fn [50];
  xmlChar local_68 [56];
  
  if (content == (xmlElementContentPtr)0x0) {
    msg = "Found NULL content in content model of %s\n";
    goto LAB_001548b0;
  }
  switch(content->type) {
  case XML_ELEMENT_CONTENT_PCDATA:
    msg = "Found PCDATA in content model of %s\n";
    goto LAB_001548b0;
  case XML_ELEMENT_CONTENT_ELEMENT:
    pxVar5 = ctxt->state;
    token = xmlBuildQName(content->name,content->prefix,local_68,0x32);
    if (token == (xmlChar *)0x0) {
      xmlVErrMemory(ctxt);
      goto LAB_00154976;
    }
    break;
  case XML_ELEMENT_CONTENT_SEQ:
    pxVar4 = ctxt->state;
    xVar1 = content->ocur;
    if (xVar1 != XML_ELEMENT_CONTENT_ONCE) {
      pxVar4 = xmlAutomataNewEpsilon(ctxt->am,pxVar4,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar4;
    }
    do {
      iVar3 = xmlValidBuildAContentModel(content->c1,ctxt,name);
      if (iVar3 == 0) {
        return 0;
      }
      content = content->c2;
    } while ((content->type == XML_ELEMENT_CONTENT_SEQ) &&
            (content->ocur == XML_ELEMENT_CONTENT_ONCE));
    iVar3 = xmlValidBuildAContentModel(content,ctxt,name);
    if (iVar3 == 0) {
      return 0;
    }
    pxVar5 = ctxt->state;
    to = xmlAutomataNewEpsilon(ctxt->am,pxVar5,(xmlAutomataStatePtr)0x0);
    ctxt->state = to;
    if (xVar1 != XML_ELEMENT_CONTENT_PLUS) {
      pxVar2 = pxVar4;
      if (xVar1 != XML_ELEMENT_CONTENT_MULT) {
joined_r0x00154828:
        pxVar4 = to;
        pxVar5 = pxVar2;
        if (xVar1 != XML_ELEMENT_CONTENT_OPT) {
          return 1;
        }
        am = ctxt->am;
        goto LAB_001549b1;
      }
      xmlAutomataNewEpsilon(ctxt->am,pxVar4,to);
    }
    am = ctxt->am;
    goto LAB_001549b1;
  case XML_ELEMENT_CONTENT_OR:
    xVar1 = content->ocur;
    if (xVar1 - XML_ELEMENT_CONTENT_MULT < 2) {
      pxVar5 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
      ctxt->state = pxVar5;
    }
    pxVar4 = ctxt->state;
    pxVar5 = xmlAutomataNewState(ctxt->am);
    do {
      ctxt->state = pxVar4;
      iVar3 = xmlValidBuildAContentModel(content->c1,ctxt,name);
      if (iVar3 == 0) {
        return 0;
      }
      xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar5);
      content = content->c2;
    } while ((content->type == XML_ELEMENT_CONTENT_OR) &&
            (content->ocur == XML_ELEMENT_CONTENT_ONCE));
    ctxt->state = pxVar4;
    iVar3 = xmlValidBuildAContentModel(content,ctxt,name);
    if (iVar3 == 0) {
      return 0;
    }
    xmlAutomataNewEpsilon(ctxt->am,ctxt->state,pxVar5);
    to = xmlAutomataNewEpsilon(ctxt->am,pxVar5,(xmlAutomataStatePtr)0x0);
    ctxt->state = to;
    if (xVar1 != XML_ELEMENT_CONTENT_PLUS) {
      pxVar2 = pxVar4;
      if (xVar1 != XML_ELEMENT_CONTENT_MULT) goto joined_r0x00154828;
      xmlAutomataNewEpsilon(ctxt->am,pxVar4,to);
    }
    am = ctxt->am;
LAB_001549b1:
    xmlAutomataNewEpsilon(am,pxVar5,pxVar4);
    return 1;
  default:
    msg = "ContentModel broken for element %s\n";
LAB_001548b0:
    xmlDoErrValid(ctxt,(xmlNodePtr)0x0,XML_ERR_INTERNAL_ERROR,2,name,(xmlChar *)0x0,(xmlChar *)0x0,0
                  ,msg,name);
    return 0;
  }
  switch(content->ocur) {
  case XML_ELEMENT_CONTENT_ONCE:
    pxVar5 = xmlAutomataNewTransition
                       (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,token,(void *)0x0);
    ctxt->state = pxVar5;
    break;
  case XML_ELEMENT_CONTENT_OPT:
    pxVar4 = xmlAutomataNewTransition
                       (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,token,(void *)0x0);
    ctxt->state = pxVar4;
    xmlAutomataNewEpsilon(ctxt->am,pxVar5,pxVar4);
    break;
  case XML_ELEMENT_CONTENT_MULT:
    pxVar5 = xmlAutomataNewEpsilon(ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0);
    goto LAB_0015491c;
  case XML_ELEMENT_CONTENT_PLUS:
    pxVar5 = xmlAutomataNewTransition
                       (ctxt->am,ctxt->state,(xmlAutomataStatePtr)0x0,token,(void *)0x0);
LAB_0015491c:
    ctxt->state = pxVar5;
    xmlAutomataNewTransition(ctxt->am,pxVar5,pxVar5,token,(void *)0x0);
  }
  if ((token != local_68) && (token != content->name)) {
    (*xmlFree)(token);
  }
LAB_00154976:
  if (token != (xmlChar *)0x0) {
    return 1;
  }
  return 0;
}

Assistant:

static int
xmlValidBuildAContentModel(xmlElementContentPtr content,
		           xmlValidCtxtPtr ctxt,
		           const xmlChar *name) {
    if (content == NULL) {
	xmlErrValidNode(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
			"Found NULL content in content model of %s\n",
			name, NULL, NULL);
	return(0);
    }
    switch (content->type) {
	case XML_ELEMENT_CONTENT_PCDATA:
	    xmlErrValidNode(ctxt, NULL, XML_ERR_INTERNAL_ERROR,
			    "Found PCDATA in content model of %s\n",
		            name, NULL, NULL);
	    return(0);
	    break;
	case XML_ELEMENT_CONTENT_ELEMENT: {
	    xmlAutomataStatePtr oldstate = ctxt->state;
	    xmlChar fn[50];
	    xmlChar *fullname;

	    fullname = xmlBuildQName(content->name, content->prefix, fn, 50);
	    if (fullname == NULL) {
	        xmlVErrMemory(ctxt);
		return(0);
	    }

	    switch (content->ocur) {
		case XML_ELEMENT_CONTENT_ONCE:
		    ctxt->state = xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, NULL, fullname, NULL);
		    break;
		case XML_ELEMENT_CONTENT_OPT:
		    ctxt->state = xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, NULL, fullname, NULL);
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    break;
		case XML_ELEMENT_CONTENT_PLUS:
		    ctxt->state = xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, NULL, fullname, NULL);
		    xmlAutomataNewTransition(ctxt->am, ctxt->state,
			                     ctxt->state, fullname, NULL);
		    break;
		case XML_ELEMENT_CONTENT_MULT:
		    ctxt->state = xmlAutomataNewEpsilon(ctxt->am,
					    ctxt->state, NULL);
		    xmlAutomataNewTransition(ctxt->am,
			    ctxt->state, ctxt->state, fullname, NULL);
		    break;
	    }
	    if ((fullname != fn) && (fullname != content->name))
		xmlFree(fullname);
	    break;
	}
	case XML_ELEMENT_CONTENT_SEQ: {
	    xmlAutomataStatePtr oldstate, oldend;
	    xmlElementContentOccur ocur;

	    /*
	     * Simply iterate over the content
	     */
	    oldstate = ctxt->state;
	    ocur = content->ocur;
	    if (ocur != XML_ELEMENT_CONTENT_ONCE) {
		ctxt->state = xmlAutomataNewEpsilon(ctxt->am, oldstate, NULL);
		oldstate = ctxt->state;
	    }
	    do {
		if (xmlValidBuildAContentModel(content->c1, ctxt, name) == 0)
                    return(0);
		content = content->c2;
	    } while ((content->type == XML_ELEMENT_CONTENT_SEQ) &&
		     (content->ocur == XML_ELEMENT_CONTENT_ONCE));
	    if (xmlValidBuildAContentModel(content, ctxt, name) == 0)
                return(0);
	    oldend = ctxt->state;
	    ctxt->state = xmlAutomataNewEpsilon(ctxt->am, oldend, NULL);
	    switch (ocur) {
		case XML_ELEMENT_CONTENT_ONCE:
		    break;
		case XML_ELEMENT_CONTENT_OPT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    break;
		case XML_ELEMENT_CONTENT_MULT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
		case XML_ELEMENT_CONTENT_PLUS:
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
	    }
	    break;
	}
	case XML_ELEMENT_CONTENT_OR: {
	    xmlAutomataStatePtr oldstate, oldend;
	    xmlElementContentOccur ocur;

	    ocur = content->ocur;
	    if ((ocur == XML_ELEMENT_CONTENT_PLUS) ||
		(ocur == XML_ELEMENT_CONTENT_MULT)) {
		ctxt->state = xmlAutomataNewEpsilon(ctxt->am,
			ctxt->state, NULL);
	    }
	    oldstate = ctxt->state;
	    oldend = xmlAutomataNewState(ctxt->am);

	    /*
	     * iterate over the subtypes and remerge the end with an
	     * epsilon transition
	     */
	    do {
		ctxt->state = oldstate;
		if (xmlValidBuildAContentModel(content->c1, ctxt, name) == 0)
                    return(0);
		xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldend);
		content = content->c2;
	    } while ((content->type == XML_ELEMENT_CONTENT_OR) &&
		     (content->ocur == XML_ELEMENT_CONTENT_ONCE));
	    ctxt->state = oldstate;
	    if (xmlValidBuildAContentModel(content, ctxt, name) == 0)
                return(0);
	    xmlAutomataNewEpsilon(ctxt->am, ctxt->state, oldend);
	    ctxt->state = xmlAutomataNewEpsilon(ctxt->am, oldend, NULL);
	    switch (ocur) {
		case XML_ELEMENT_CONTENT_ONCE:
		    break;
		case XML_ELEMENT_CONTENT_OPT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    break;
		case XML_ELEMENT_CONTENT_MULT:
		    xmlAutomataNewEpsilon(ctxt->am, oldstate, ctxt->state);
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
		case XML_ELEMENT_CONTENT_PLUS:
		    xmlAutomataNewEpsilon(ctxt->am, oldend, oldstate);
		    break;
	    }
	    break;
	}
	default:
	    xmlErrValid(ctxt, XML_ERR_INTERNAL_ERROR,
	                "ContentModel broken for element %s\n",
			(const char *) name);
	    return(0);
    }
    return(1);
}